

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_schnorrsig.cpp
# Opt level: O1

void __thiscall
SchnorrPubkey_TweakAddFromPrivkey_Test::~SchnorrPubkey_TweakAddFromPrivkey_Test
          (SchnorrPubkey_TweakAddFromPrivkey_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(SchnorrPubkey, TweakAddFromPrivkey) {
  ByteData256 tweak1("45cfe14923541d2908a64f32aaf09b703dbd2cfb256830b0eebc5573b15a4476");
  Privkey tweaked_sk;
  bool parity = false;
  auto actual_pubkey = SchnorrPubkey::CreateTweakAddFromPrivkey(
      sk, tweak1, &tweaked_sk, &parity);

  std::string exp_pubkey1 = "ac52f50b28cdd4d3bcb7f0d5cb533f232e4c4ef12fbf3e718420b84d4e3c3440";
  std::string exp_privkey1 = "dd43698cf5f96d33bf895c28d67b5ffbd736c2d4cef91e1f8ce0e38c31a709c8";

  EXPECT_EQ(exp_pubkey1, actual_pubkey.GetHex());
  EXPECT_EQ(exp_privkey1, tweaked_sk.GetHex());
  EXPECT_EQ(pubkey_parity, parity);

  Privkey key = sk;
  if (parity) key = key.CreateNegate();
  key = key.CreateTweakAdd(tweak1);
  EXPECT_EQ(exp_privkey1, key.GetHex());
}